

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

_Bool pop3_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  int iVar1;
  
  if ((len < 4) || (*(int *)line != 0x5252452d)) {
    if ((conn->proto).imapc.state == IMAP_CAPABILITY) {
      if ((len == 0) || (iVar1 = 0x2b, *line != '.')) {
        iVar1 = 0x2a;
      }
    }
    else {
      if (len < 3) {
        if (len == 0) {
          return false;
        }
      }
      else if (line[2] == 'K' && *(short *)line == 0x4f2b) {
        iVar1 = 0x2b;
        goto LAB_001365f3;
      }
      iVar1 = 0x2a;
      if (*line != '+') {
        return false;
      }
    }
  }
  else {
    iVar1 = 0x2d;
  }
LAB_001365f3:
  *resp = iVar1;
  return true;
}

Assistant:

static bool pop3_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* Do we have an error response? */
  if(len >= 4 && !memcmp("-ERR", line, 4)) {
    *resp = '-';

    return TRUE;
  }

  /* Are we processing CAPA command responses? */
  if(pop3c->state == POP3_CAPA) {
    /* Do we have the terminating line? */
    if(len >= 1 && !memcmp(line, ".", 1))
      /* Treat the response as a success */
      *resp = '+';
    else
      /* Treat the response as an untagged continuation */
      *resp = '*';

    return TRUE;
  }

  /* Do we have a success response? */
  if(len >= 3 && !memcmp("+OK", line, 3)) {
    *resp = '+';

    return TRUE;
  }

  /* Do we have a continuation response? */
  if(len >= 1 && !memcmp("+", line, 1)) {
    *resp = '*';

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}